

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-sched.cpp
# Opt level: O0

bool gpt2_model_load(string *fname,gpt2_model *model,gpt_vocab *vocab,gpt_params *params)

{
  mapped_type pgVar1;
  void *pvVar2;
  FILE *pFVar3;
  value_type pgVar4;
  value_type pgVar5;
  byte bVar6;
  bool bVar7;
  int iVar8;
  undefined8 uVar9;
  char *pcVar10;
  mapped_type *pmVar11;
  mapped_type *this;
  long lVar12;
  mapped_type *ppgVar13;
  ggml_tensor *pgVar14;
  reference ppgVar15;
  reference ppgVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  undefined8 uVar20;
  mapped_type *ppgVar21;
  pointer ppVar22;
  long in_RCX;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>
  *__y;
  uint *in_RSI;
  string *in_RDI;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  __enable_if_t<is_constructible<value_type,_pair<ggml_backend_*,_ggml_tallocr>_>::value,_pair<iterator,_bool>_>
  _Var26;
  ggml_tallocr alloc_3;
  ggml_backend_t backend_input;
  size_t input_size;
  ggml_tallocr *alloc_head;
  ggml_tallocr *alloc_2;
  ggml_backend_t backend_1;
  size_t bpe;
  mapped_type tensor;
  string name_1;
  int i_2;
  int32_t ne [2];
  int32_t nelements;
  int32_t ttype;
  int32_t length;
  int32_t n_dims;
  vector<char,_std::allocator<char>_> read_buf;
  bool has_lm_head;
  size_t total_size;
  ggml_tallocr alloc_1;
  ggml_backend_t backend_kv;
  size_t memory_size;
  int n_elements;
  int n_mem;
  int n_ctx_1;
  int n_layer_1;
  int n_embd_1;
  gpt2_hparams *hparams_2;
  ggml_tallocr alloc;
  ggml_backend_buffer_t buffer;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>
  it_1;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
  *__range2;
  size_t size;
  ggml_backend *backend;
  iterator __end1_1;
  iterator __begin1_1;
  vector<ggml_backend_*,_std::allocator<ggml_backend_*>_> *__range1_1;
  map<ggml_backend_*,_ggml_tallocr,_std::less<ggml_backend_*>,_std::allocator<std::pair<ggml_backend_*const,_ggml_tallocr>_>_>
  backend_buffers;
  int layer_1;
  string *name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>
  it;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
  *__range1;
  int i_gpu_first_layer;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
  tensor_backends;
  ggml_backend_t backend_cpu;
  ggml_backend_t backend_gpu;
  value_type *layer;
  int i_1;
  int n_vocab_1;
  int n_ctx;
  int n_layer;
  int n_embd;
  gpt2_hparams *hparams_1;
  ggml_init_params params_1;
  size_t n_tensors;
  ggml_context **ctx;
  ggml_type wtype;
  uint32_t len;
  int i;
  vector<char,_std::allocator<char>_> buf;
  string word;
  int32_t n_vocab;
  int32_t qntvr;
  gpt2_hparams *hparams;
  uint32_t magic;
  ifstream fin;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>
  *this_00;
  gpt_params *params_00;
  undefined7 in_stack_ffffffffffffef70;
  char in_stack_ffffffffffffef77;
  size_type in_stack_ffffffffffffef78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffef80;
  value_type local_1078;
  allocator<char> *in_stack_ffffffffffffef90;
  key_type *in_stack_ffffffffffffef98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffefa0;
  undefined8 in_stack_ffffffffffffefa8;
  value_type local_f10;
  undefined1 local_b88 [32];
  value_type local_b68;
  long local_b60;
  allocator<char> local_b51;
  string local_b50 [32];
  _Base_ptr local_b30;
  ggml_tallocr *local_b28;
  _Base_ptr local_b20;
  ggml_tallocr *local_b18;
  mapped_type local_b10;
  long local_b08;
  mapped_type local_b00;
  _Self local_af8;
  _Self local_af0;
  allocator<char> local_ae1;
  string local_ae0 [36];
  int local_abc;
  int local_ab8 [4];
  undefined1 local_aa8 [4];
  int local_aa4 [8];
  byte local_a81;
  long local_a80;
  undefined1 local_a78 [32];
  value_type local_a58;
  long local_a50;
  int local_a44;
  uint local_a40;
  uint local_a3c;
  uint local_a38;
  uint local_a34;
  uint *local_a30;
  undefined8 local_a28;
  _Base_ptr local_a20;
  undefined1 local_a18;
  undefined1 local_9e8 [32];
  undefined8 local_9c8;
  undefined8 local_9a0;
  _Self local_998;
  _Self local_990;
  uint *local_988;
  long local_980;
  ggml_backend *local_978;
  ggml_backend **local_970;
  __normal_iterator<ggml_backend_**,_std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>_>
  local_968;
  uint *local_960;
  string local_928 [36];
  int local_904;
  string local_900 [32];
  undefined1 *local_8e0;
  undefined1 local_8d8 [40];
  _Self local_8b0;
  _Self local_8a8;
  uint *local_8a0;
  int local_894;
  value_type local_860;
  value_type local_858;
  string local_850 [32];
  string local_830 [32];
  string local_810 [32];
  string local_7f0 [32];
  string local_7d0 [32];
  string local_7b0 [32];
  string local_790 [32];
  string local_770 [32];
  string local_750 [32];
  string local_730 [32];
  string local_710 [32];
  string local_6f0 [32];
  string local_6d0 [32];
  string local_6b0 [32];
  string local_690 [32];
  string local_670 [32];
  string local_650 [32];
  string local_630 [32];
  string local_610 [32];
  string local_5f0 [32];
  string local_5d0 [32];
  string local_5b0 [32];
  string local_590 [32];
  string local_570 [32];
  string local_550 [32];
  string local_530 [32];
  string local_510 [32];
  string local_4f0 [32];
  string local_4d0 [32];
  string local_4b0 [32];
  string local_490 [32];
  string local_470 [32];
  string local_450 [32];
  string local_430 [32];
  string local_410 [32];
  string local_3f0 [32];
  reference local_3d0;
  int local_3c8;
  allocator<char> local_3c1;
  string local_3c0 [39];
  allocator<char> local_399;
  string local_398 [39];
  allocator<char> local_371;
  string local_370 [39];
  allocator<char> local_349;
  string local_348 [39];
  allocator<char> local_321;
  string local_320 [32];
  uint local_300;
  uint local_2fc;
  uint local_2f8;
  uint local_2f4;
  uint *local_2f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>
  *local_2e8;
  undefined8 uStack_2e0;
  gpt_params *local_2d8;
  undefined8 uStack_2c0;
  undefined1 local_2b8;
  undefined7 uStack_2b7;
  long local_2b0;
  uint *local_2a8;
  int local_2a0;
  undefined1 local_29c [4];
  int local_298;
  allocator<char> local_291 [25];
  string local_278 [32];
  uint local_258;
  uint local_254;
  uint *local_250;
  int local_244;
  int local_240;
  long local_230 [65];
  long local_28;
  uint *local_18;
  string *local_10;
  byte local_1;
  
  local_28 = in_RCX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  uVar9 = std::__cxx11::string::c_str();
  printf("%s: loading model from \'%s\'\n","gpt2_model_load",uVar9);
  std::ifstream::ifstream(local_230,local_10,_S_bin);
  bVar6 = std::ios::operator!((ios *)((long)local_230 + *(long *)(local_230[0] + -0x18)));
  pFVar3 = _stderr;
  if ((bVar6 & 1) == 0) {
    std::istream::read((char *)local_230,(long)&local_244);
    pFVar3 = _stderr;
    if (local_244 == 0x67676d6c) {
      local_250 = local_18;
      std::istream::read((char *)local_230,(long)local_18);
      std::istream::read((char *)local_230,(long)(local_250 + 1));
      std::istream::read((char *)local_230,(long)(local_250 + 2));
      std::istream::read((char *)local_230,(long)(local_250 + 3));
      std::istream::read((char *)local_230,(long)(local_250 + 4));
      std::istream::read((char *)local_230,(long)(local_250 + 5));
      local_254 = (int)local_250[5] / 1000;
      printf("%s: n_vocab = %d\n","gpt2_model_load",(ulong)*local_250);
      printf("%s: n_ctx   = %d\n","gpt2_model_load",(ulong)local_250[1]);
      printf("%s: n_embd  = %d\n","gpt2_model_load",(ulong)local_250[2]);
      printf("%s: n_head  = %d\n","gpt2_model_load",(ulong)local_250[3]);
      printf("%s: n_layer = %d\n","gpt2_model_load",(ulong)local_250[4]);
      printf("%s: ftype   = %d\n","gpt2_model_load",(ulong)local_250[5]);
      printf("%s: qntvr   = %d\n","gpt2_model_load",(ulong)local_254);
      local_250[5] = (int)local_250[5] % 1000;
      local_258 = 0;
      std::istream::read((char *)local_230,(long)&local_258);
      pFVar3 = _stderr;
      if (local_258 == *local_18) {
        std::__cxx11::string::string(local_278);
        std::allocator<char>::allocator();
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffef80,
                   in_stack_ffffffffffffef78,
                   (allocator_type *)CONCAT17(in_stack_ffffffffffffef77,in_stack_ffffffffffffef70));
        std::allocator<char>::~allocator(local_291);
        for (local_298 = 0; local_298 < (int)local_258; local_298 = local_298 + 1) {
          std::istream::read((char *)local_230,(long)local_29c);
          std::vector<char,_std::allocator<char>_>::resize
                    ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffef80,
                     in_stack_ffffffffffffef78);
          pcVar10 = std::vector<char,_std::allocator<char>_>::data
                              ((vector<char,_std::allocator<char>_> *)0x1118ed);
          std::istream::read((char *)local_230,(long)pcVar10);
          pcVar10 = std::vector<char,_std::allocator<char>_>::data
                              ((vector<char,_std::allocator<char>_> *)0x111915);
          std::__cxx11::string::assign((char *)local_278,(ulong)pcVar10);
          iVar8 = local_298;
          pmVar11 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                  *)in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98);
          *pmVar11 = iVar8;
          this = std::
                 map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_ffffffffffffefa0,(key_type *)in_stack_ffffffffffffef98);
          std::__cxx11::string::operator=((string *)this,local_278);
        }
        std::vector<char,_std::allocator<char>_>::~vector
                  ((vector<char,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffef77,in_stack_ffffffffffffef70));
        std::__cxx11::string::~string(local_278);
        local_2a0 = ggml_ftype_to_ggml_type(local_18[5]);
        pFVar3 = _stderr;
        if (local_2a0 == 0x27) {
          uVar9 = std::__cxx11::string::c_str();
          fprintf(pFVar3,"%s: invalid model file \'%s\' (bad ftype value %d)\n","gpt2_model_load",
                  uVar9,(ulong)local_18[5]);
          local_1 = 0;
          local_240 = 1;
        }
        else {
          local_2a8 = local_18 + 0x1c;
          local_2b0 = (long)(int)(local_18[4] * 0xc + 0xb);
          lVar12 = ggml_tensor_overhead();
          __y = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>
                 *)(lVar12 * local_2b0);
          uStack_2c0 = 0;
          local_2b8 = 1;
          params_00 = (gpt_params *)CONCAT71(uStack_2b7,1);
          uStack_2e0 = 0;
          this_00 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>
                     *)0x0;
          local_2e8 = __y;
          local_2d8 = params_00;
          uVar9 = ggml_init();
          *(undefined8 *)(local_18 + 0x1c) = uVar9;
          if (*(long *)(local_18 + 0x1c) == 0) {
            fprintf(_stderr,"%s: ggml_init() failed\n","gpt2_model_load");
            local_1 = 0;
            local_240 = 1;
          }
          else {
            local_2f0 = local_18;
            local_2f4 = local_18[2];
            local_2f8 = local_18[4];
            local_2fc = local_18[1];
            local_300 = *local_18;
            std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::resize
                      ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)in_stack_ffffffffffffef80,
                       in_stack_ffffffffffffef78);
            uVar9 = ggml_new_tensor_1d(*(undefined8 *)local_2a8,0,(long)(int)local_2f4);
            *(undefined8 *)(local_18 + 8) = uVar9;
            uVar9 = ggml_new_tensor_1d(*(undefined8 *)local_2a8,0,(long)(int)local_2f4);
            *(undefined8 *)(local_18 + 10) = uVar9;
            uVar9 = ggml_new_tensor_2d(*(undefined8 *)local_2a8,local_2a0,(long)(int)local_2f4,
                                       (long)(int)local_300);
            *(undefined8 *)(local_18 + 0xc) = uVar9;
            uVar9 = ggml_new_tensor_2d(*(undefined8 *)local_2a8,0,(long)(int)local_2f4,
                                       (long)(int)local_2fc);
            *(undefined8 *)(local_18 + 0xe) = uVar9;
            uVar9 = ggml_new_tensor_2d(*(undefined8 *)local_2a8,local_2a0,(long)(int)local_2f4,
                                       (long)(int)local_300);
            *(undefined8 *)(local_18 + 0x10) = uVar9;
            pgVar1 = *(mapped_type *)(local_18 + 8);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_ffffffffffffefa0,(char *)in_stack_ffffffffffffef98,
                       in_stack_ffffffffffffef90);
            ppgVar13 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                     *)in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98);
            *ppgVar13 = pgVar1;
            std::__cxx11::string::~string(local_320);
            std::allocator<char>::~allocator(&local_321);
            pgVar1 = *(mapped_type *)(local_18 + 10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_ffffffffffffefa0,(char *)in_stack_ffffffffffffef98,
                       in_stack_ffffffffffffef90);
            ppgVar13 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                     *)in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98);
            *ppgVar13 = pgVar1;
            std::__cxx11::string::~string(local_348);
            std::allocator<char>::~allocator(&local_349);
            pgVar1 = *(mapped_type *)(local_18 + 0xc);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_ffffffffffffefa0,(char *)in_stack_ffffffffffffef98,
                       in_stack_ffffffffffffef90);
            ppgVar13 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                     *)in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98);
            *ppgVar13 = pgVar1;
            std::__cxx11::string::~string(local_370);
            std::allocator<char>::~allocator(&local_371);
            pgVar1 = *(mapped_type *)(local_18 + 0xe);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_ffffffffffffefa0,(char *)in_stack_ffffffffffffef98,
                       in_stack_ffffffffffffef90);
            ppgVar13 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                     *)in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98);
            *ppgVar13 = pgVar1;
            std::__cxx11::string::~string(local_398);
            std::allocator<char>::~allocator(&local_399);
            pgVar1 = *(mapped_type *)(local_18 + 0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_ffffffffffffefa0,(char *)in_stack_ffffffffffffef98,
                       in_stack_ffffffffffffef90);
            ppgVar13 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                     *)in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98);
            *ppgVar13 = pgVar1;
            std::__cxx11::string::~string(local_3c0);
            std::allocator<char>::~allocator(&local_3c1);
            for (local_3c8 = 0; local_3c8 < (int)local_2f8; local_3c8 = local_3c8 + 1) {
              local_3d0 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                                    ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)
                                     (local_18 + 0x12),(long)local_3c8);
              pgVar14 = (ggml_tensor *)
                        ggml_new_tensor_1d(*(undefined8 *)local_2a8,0,(long)(int)local_2f4);
              local_3d0->ln_1_g = pgVar14;
              pgVar14 = (ggml_tensor *)
                        ggml_new_tensor_1d(*(undefined8 *)local_2a8,0,(long)(int)local_2f4);
              local_3d0->ln_1_b = pgVar14;
              pgVar14 = (ggml_tensor *)
                        ggml_new_tensor_1d(*(undefined8 *)local_2a8,0,(long)(int)local_2f4);
              local_3d0->ln_2_g = pgVar14;
              pgVar14 = (ggml_tensor *)
                        ggml_new_tensor_1d(*(undefined8 *)local_2a8,0,(long)(int)local_2f4);
              local_3d0->ln_2_b = pgVar14;
              pgVar14 = (ggml_tensor *)
                        ggml_new_tensor_2d(*(undefined8 *)local_2a8,local_2a0,(long)(int)local_2f4,
                                           (long)(int)(local_2f4 * 3));
              local_3d0->c_attn_attn_w = pgVar14;
              pgVar14 = (ggml_tensor *)
                        ggml_new_tensor_1d(*(undefined8 *)local_2a8,0,(long)(int)(local_2f4 * 3));
              local_3d0->c_attn_attn_b = pgVar14;
              pgVar14 = (ggml_tensor *)
                        ggml_new_tensor_2d(*(undefined8 *)local_2a8,local_2a0,(long)(int)local_2f4);
              local_3d0->c_attn_proj_w = pgVar14;
              pgVar14 = (ggml_tensor *)
                        ggml_new_tensor_1d(*(undefined8 *)local_2a8,0,(long)(int)local_2f4);
              local_3d0->c_attn_proj_b = pgVar14;
              pgVar14 = (ggml_tensor *)
                        ggml_new_tensor_2d(*(undefined8 *)local_2a8,local_2a0,(long)(int)local_2f4,
                                           (long)(int)(local_2f4 << 2));
              local_3d0->c_mlp_fc_w = pgVar14;
              pgVar14 = (ggml_tensor *)
                        ggml_new_tensor_1d(*(undefined8 *)local_2a8,0,(long)(int)(local_2f4 << 2));
              local_3d0->c_mlp_fc_b = pgVar14;
              pgVar14 = (ggml_tensor *)
                        ggml_new_tensor_2d(*(undefined8 *)local_2a8,local_2a0,
                                           (long)(int)(local_2f4 << 2));
              local_3d0->c_mlp_proj_w = pgVar14;
              pgVar14 = (ggml_tensor *)
                        ggml_new_tensor_1d(*(undefined8 *)local_2a8,0,(long)(int)local_2f4);
              local_3d0->c_mlp_proj_b = pgVar14;
              pgVar14 = local_3d0->ln_1_g;
              std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffefa8 >> 0x20));
              std::operator+((char *)params_00,&this_00->first);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             params_00,(char *)this_00);
              ppgVar13 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                       *)in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98);
              *ppgVar13 = pgVar14;
              std::__cxx11::string::~string(local_3f0);
              std::__cxx11::string::~string(local_410);
              std::__cxx11::string::~string(local_430);
              pgVar14 = local_3d0->ln_1_b;
              std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffefa8 >> 0x20));
              std::operator+((char *)params_00,&this_00->first);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             params_00,(char *)this_00);
              ppgVar13 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                       *)in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98);
              *ppgVar13 = pgVar14;
              std::__cxx11::string::~string(local_450);
              std::__cxx11::string::~string(local_470);
              std::__cxx11::string::~string(local_490);
              pgVar14 = local_3d0->ln_2_g;
              std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffefa8 >> 0x20));
              std::operator+((char *)params_00,&this_00->first);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             params_00,(char *)this_00);
              ppgVar13 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                       *)in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98);
              *ppgVar13 = pgVar14;
              std::__cxx11::string::~string(local_4b0);
              std::__cxx11::string::~string(local_4d0);
              std::__cxx11::string::~string(local_4f0);
              pgVar14 = local_3d0->ln_2_b;
              std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffefa8 >> 0x20));
              std::operator+((char *)params_00,&this_00->first);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             params_00,(char *)this_00);
              ppgVar13 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                       *)in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98);
              *ppgVar13 = pgVar14;
              std::__cxx11::string::~string(local_510);
              std::__cxx11::string::~string(local_530);
              std::__cxx11::string::~string(local_550);
              pgVar14 = local_3d0->c_attn_attn_w;
              std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffefa8 >> 0x20));
              std::operator+((char *)params_00,&this_00->first);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             params_00,(char *)this_00);
              ppgVar13 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                       *)in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98);
              *ppgVar13 = pgVar14;
              std::__cxx11::string::~string(local_570);
              std::__cxx11::string::~string(local_590);
              std::__cxx11::string::~string(local_5b0);
              pgVar14 = local_3d0->c_attn_attn_b;
              std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffefa8 >> 0x20));
              std::operator+((char *)params_00,&this_00->first);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             params_00,(char *)this_00);
              ppgVar13 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                       *)in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98);
              *ppgVar13 = pgVar14;
              std::__cxx11::string::~string(local_5d0);
              std::__cxx11::string::~string(local_5f0);
              std::__cxx11::string::~string(local_610);
              pgVar14 = local_3d0->c_attn_proj_w;
              std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffefa8 >> 0x20));
              std::operator+((char *)params_00,&this_00->first);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             params_00,(char *)this_00);
              ppgVar13 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                       *)in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98);
              *ppgVar13 = pgVar14;
              std::__cxx11::string::~string(local_630);
              std::__cxx11::string::~string(local_650);
              std::__cxx11::string::~string(local_670);
              pgVar14 = local_3d0->c_attn_proj_b;
              std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffefa8 >> 0x20));
              std::operator+((char *)params_00,&this_00->first);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             params_00,(char *)this_00);
              ppgVar13 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                       *)in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98);
              *ppgVar13 = pgVar14;
              std::__cxx11::string::~string(local_690);
              std::__cxx11::string::~string(local_6b0);
              std::__cxx11::string::~string(local_6d0);
              pgVar14 = local_3d0->c_mlp_fc_w;
              std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffefa8 >> 0x20));
              std::operator+((char *)params_00,&this_00->first);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             params_00,(char *)this_00);
              ppgVar13 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                       *)in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98);
              *ppgVar13 = pgVar14;
              std::__cxx11::string::~string(local_6f0);
              std::__cxx11::string::~string(local_710);
              std::__cxx11::string::~string(local_730);
              pgVar14 = local_3d0->c_mlp_fc_b;
              std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffefa8 >> 0x20));
              std::operator+((char *)params_00,&this_00->first);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             params_00,(char *)this_00);
              ppgVar13 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                       *)in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98);
              *ppgVar13 = pgVar14;
              std::__cxx11::string::~string(local_750);
              std::__cxx11::string::~string(local_770);
              std::__cxx11::string::~string(local_790);
              pgVar14 = local_3d0->c_mlp_proj_w;
              std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffefa8 >> 0x20));
              std::operator+((char *)params_00,&this_00->first);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             params_00,(char *)this_00);
              ppgVar13 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                       *)in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98);
              *ppgVar13 = pgVar14;
              std::__cxx11::string::~string(local_7b0);
              std::__cxx11::string::~string(local_7d0);
              std::__cxx11::string::~string(local_7f0);
              pgVar14 = local_3d0->c_mlp_proj_b;
              std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffefa8 >> 0x20));
              std::operator+((char *)params_00,&this_00->first);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             params_00,(char *)this_00);
              ppgVar13 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                       *)in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98);
              *ppgVar13 = pgVar14;
              std::__cxx11::string::~string(local_810);
              std::__cxx11::string::~string(local_830);
              std::__cxx11::string::~string(local_850);
            }
            init_backends((gpt2_model *)
                          CONCAT17(in_stack_ffffffffffffef77,in_stack_ffffffffffffef70),params_00);
            ppgVar15 = std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>::front
                                 ((vector<ggml_backend_*,_std::allocator<ggml_backend_*>_> *)this_00
                                 );
            local_858 = *ppgVar15;
            ppgVar15 = std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>::back
                                 ((vector<ggml_backend_*,_std::allocator<ggml_backend_*>_> *)this_00
                                 );
            local_860 = *ppgVar15;
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
            ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                   *)0x1134cf);
            local_894 = local_18[4] - *(int *)(local_28 + 0x18);
            local_8a0 = local_18 + 0x2e;
            local_8a8._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                 ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                          *)__y);
            local_8b0._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                 ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                        *)__y);
            while (bVar7 = std::operator!=(&local_8a8,&local_8b0), bVar7) {
              std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>
              ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>
                           *)0x113557);
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>
              ::pair(this_00,__y);
              local_8e0 = local_8d8;
              bVar7 = std::operator==(&this_00->first,(char *)__y);
              if ((bVar7) || (bVar7 = std::operator==(&this_00->first,(char *)__y), bVar7)) {
                pgVar5 = local_858;
                pgVar4 = local_860;
                if ((int)local_18[4] < *(int *)(local_28 + 0x18)) {
                  ppgVar21 = std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                                           *)in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98);
                  *ppgVar21 = pgVar5;
                }
                else {
                  ppgVar21 = std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                                           *)in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98);
                  *ppgVar21 = pgVar4;
                }
              }
              bVar7 = std::operator==(&this_00->first,(char *)__y);
              if (((bVar7) || (bVar7 = std::operator==(&this_00->first,(char *)__y), bVar7)) ||
                 (bVar7 = std::operator==(&this_00->first,(char *)__y), bVar7)) {
                pgVar5 = local_858;
                pgVar4 = local_860;
                if (*(int *)(local_28 + 0x18) < 1) {
                  ppgVar21 = std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                                           *)in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98);
                  *ppgVar21 = pgVar4;
                }
                else {
                  ppgVar21 = std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                                           *)in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98);
                  *ppgVar21 = pgVar5;
                }
              }
              std::__cxx11::string::substr((ulong)local_900,(ulong)local_8e0);
              bVar7 = std::operator==(&this_00->first,(char *)__y);
              std::__cxx11::string::~string(local_900);
              if (bVar7) {
                std::__cxx11::string::substr((ulong)local_928,(ulong)local_8e0);
                iVar8 = std::__cxx11::stoi(&this_00->first,(size_t *)__y,0);
                std::__cxx11::string::~string(local_928);
                pgVar5 = local_858;
                pgVar4 = local_860;
                local_904 = iVar8;
                if (iVar8 < local_894) {
                  ppgVar21 = std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                                           *)in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98);
                  *ppgVar21 = pgVar4;
                }
                else {
                  ppgVar21 = std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                                           *)in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98);
                  *ppgVar21 = pgVar5;
                }
              }
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>
              ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>
                       *)0x113963);
              std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>
              ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>
                            *)this_00);
            }
            std::
            map<ggml_backend_*,_ggml_tallocr,_std::less<ggml_backend_*>,_std::allocator<std::pair<ggml_backend_*const,_ggml_tallocr>_>_>
            ::map((map<ggml_backend_*,_ggml_tallocr,_std::less<ggml_backend_*>,_std::allocator<std::pair<ggml_backend_*const,_ggml_tallocr>_>_>
                   *)0x113994);
            local_960 = local_18 + 0x1e;
            local_968._M_current =
                 (ggml_backend **)
                 std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>::begin
                           ((vector<ggml_backend_*,_std::allocator<ggml_backend_*>_> *)__y);
            local_970 = (ggml_backend **)
                        std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>::end
                                  ((vector<ggml_backend_*,_std::allocator<ggml_backend_*>_> *)__y);
            while (bVar7 = __gnu_cxx::operator!=
                                     ((__normal_iterator<ggml_backend_**,_std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>_>
                                       *)this_00,
                                      (__normal_iterator<ggml_backend_**,_std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>_>
                                       *)__y), bVar7) {
              ppgVar16 = __gnu_cxx::
                         __normal_iterator<ggml_backend_**,_std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>_>
                         ::operator*(&local_968);
              local_978 = *ppgVar16;
              local_980 = 0;
              local_988 = local_18 + 0x2e;
              local_990._M_node =
                   (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                   ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                            *)__y);
              local_998._M_node =
                   (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                   ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                          *)__y);
              while (bVar7 = std::operator!=(&local_990,&local_998), bVar7) {
                std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>
                ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>
                             *)0x113a7f);
                std::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>
                ::pair(this_00,__y);
                ppgVar21 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                                         *)in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98);
                if (*ppgVar21 == local_978) {
                  lVar12 = ggml_nbytes(local_9a0);
                  local_980 = lVar12 + 0x200 + local_980;
                }
                std::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>
                ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>
                         *)0x113b48);
                std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>
                ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>
                              *)this_00);
              }
              if (local_980 == 0) {
                local_a28 = 0;
                std::vector<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_>::
                push_back((vector<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_> *)
                          this_00,(value_type *)__y);
              }
              else {
                uVar9 = ggml_backend_name(local_978);
                auVar23._8_4_ = (int)((ulong)local_980 >> 0x20);
                auVar23._0_8_ = local_980;
                auVar23._12_4_ = 0x45300000;
                printf("%s: %8s buffer size = %8.2f MB\n",
                       ((auVar23._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)local_980) - 4503599627370496.0)) *
                       0.0009765625 * 0.0009765625,"gpt2_model_load",uVar9);
                local_9c8 = ggml_backend_alloc_buffer(local_978,local_980);
                ggml_backend_buffer_set_usage(local_9c8,1);
                std::vector<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_>::
                push_back((vector<ggml_backend_buffer_*,_std::allocator<ggml_backend_buffer_*>_> *)
                          CONCAT17(in_stack_ffffffffffffef77,in_stack_ffffffffffffef70),
                          (value_type *)params_00);
                ggml_tallocr_new(local_9e8,local_9c8);
                std::make_pair<ggml_backend*&,ggml_tallocr>
                          ((ggml_backend **)this_00,(ggml_tallocr *)__y);
                _Var26 = std::
                         map<ggml_backend*,ggml_tallocr,std::less<ggml_backend*>,std::allocator<std::pair<ggml_backend*const,ggml_tallocr>>>
                         ::insert<std::pair<ggml_backend*,ggml_tallocr>>
                                   ((map<ggml_backend_*,_ggml_tallocr,_std::less<ggml_backend_*>,_std::allocator<std::pair<ggml_backend_*const,_ggml_tallocr>_>_>
                                     *)CONCAT17(in_stack_ffffffffffffef77,in_stack_ffffffffffffef70)
                                    ,(pair<ggml_backend_*,_ggml_tallocr> *)params_00);
                local_a20 = (_Base_ptr)_Var26.first._M_node;
                local_a18 = _Var26.second;
              }
              __gnu_cxx::
              __normal_iterator<ggml_backend_**,_std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>_>
              ::operator++(&local_968);
            }
            local_a30 = local_18;
            local_a34 = local_18[2];
            local_a38 = local_18[4];
            local_a3c = local_18[1];
            local_a40 = local_a38 * local_a3c;
            local_a44 = local_a34 * local_a40;
            uVar9 = ggml_new_tensor_1d(*(undefined8 *)local_2a8,0,(long)local_a44);
            *(undefined8 *)(local_18 + 0x18) = uVar9;
            uVar9 = ggml_new_tensor_1d(*(undefined8 *)local_2a8,0,(long)local_a44);
            *(undefined8 *)(local_18 + 0x1a) = uVar9;
            ggml_set_name(*(undefined8 *)(local_18 + 0x18),"model/memory_k");
            ggml_set_name(*(undefined8 *)(local_18 + 0x1a),"model/memory_v");
            lVar12 = ggml_nbytes(*(undefined8 *)(local_18 + 0x18));
            local_a50 = ggml_nbytes(*(undefined8 *)(local_18 + 0x1a));
            local_a50 = lVar12 + local_a50;
            auVar24._8_4_ = (int)((ulong)local_a50 >> 0x20);
            auVar24._0_8_ = local_a50;
            auVar24._12_4_ = 0x45300000;
            printf("%s: memory size = %8.2f MB, n_mem = %d\n",
                   ((auVar24._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)local_a50) - 4503599627370496.0)) *
                   0.0009765625 * 0.0009765625,"gpt2_model_load",(ulong)local_a40);
            if (*(int *)(local_28 + 0x18) < (int)local_a30[4] / 2) {
              local_f10 = local_860;
            }
            else {
              local_f10 = local_858;
            }
            local_a58 = local_f10;
            uVar9 = ggml_backend_name(local_f10);
            printf("%s: backend_kv = %s\n","gpt2_model_load",uVar9);
            uVar9 = ggml_backend_alloc_buffer(local_a58,local_a50 + 0x400);
            *(undefined8 *)(local_18 + 0x2a) = uVar9;
            ggml_tallocr_new(local_a78,*(undefined8 *)(local_18 + 0x2a));
            ggml_tallocr_alloc(local_a78,*(undefined8 *)(local_18 + 0x18));
            ggml_tallocr_alloc(local_a78,*(undefined8 *)(local_18 + 0x1a));
            local_a80 = 0;
            local_a81 = 0;
            std::vector<char,_std::allocator<char>_>::vector
                      ((vector<char,_std::allocator<char>_> *)0x114007);
            do {
              std::istream::read((char *)local_230,(long)local_aa4);
              std::istream::read((char *)local_230,(long)local_aa8);
              std::istream::read((char *)local_230,(long)(local_ab8 + 3));
              bVar6 = std::ios::eof();
              if ((bVar6 & 1) != 0) {
                auVar25._8_4_ = (int)((ulong)local_a80 >> 0x20);
                auVar25._0_8_ = local_a80;
                auVar25._12_4_ = 0x45300000;
                printf("%s: model size  = %8.2f MB\n",
                       ((auVar25._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)local_a80) - 4503599627370496.0)) *
                       0.0009765625 * 0.0009765625,"gpt2_model_load");
                local_240 = 0;
                break;
              }
              local_ab8[2] = 1;
              local_ab8[0] = 1;
              local_ab8[1] = 1;
              for (local_abc = 0; local_abc < local_aa4[0]; local_abc = local_abc + 1) {
                std::istream::read((char *)local_230,(long)(local_ab8 + local_abc));
                local_ab8[2] = local_ab8[local_abc] * local_ab8[2];
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_ffffffffffffef80,in_stack_ffffffffffffef78,
                         in_stack_ffffffffffffef77,(allocator<char> *)params_00);
              std::allocator<char>::~allocator(&local_ae1);
              lVar12 = std::__cxx11::string::operator[]((ulong)local_ae0);
              std::istream::read((char *)local_230,lVar12);
              local_af0._M_node =
                   (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                   ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                           *)__y,(key_type *)0x1141dd);
              local_af8._M_node =
                   (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                   ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                          *)__y);
              bVar7 = std::operator==(&local_af0,&local_af8);
              pFVar3 = _stderr;
              if (bVar7) {
                uVar9 = std::__cxx11::string::c_str();
                fprintf(pFVar3,"%s: unknown tensor \'%s\' in model file\n","gpt2_model_load",uVar9);
                local_1 = 0;
                local_240 = 1;
              }
              else {
                ppgVar13 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                         *)in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98);
                pgVar1 = *ppgVar13;
                local_b00 = pgVar1;
                uVar9 = std::__cxx11::string::c_str();
                ggml_set_name(pgVar1,uVar9);
                lVar12 = ggml_nelements(local_b00);
                pFVar3 = _stderr;
                if (lVar12 == local_ab8[2]) {
                  if ((local_b00->ne[0] == (long)local_ab8[0]) &&
                     (local_b00->ne[1] == (long)local_ab8[1])) {
                    local_b08 = ggml_type_size(local_ab8[3]);
                    uVar17 = local_ab8[2] * local_b08;
                    uVar18 = ggml_blck_size(local_b00->type);
                    uVar19 = ggml_nbytes(local_b00);
                    pFVar3 = _stderr;
                    if (uVar17 / uVar18 == uVar19) {
                      ppgVar21 = std::
                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                                               *)in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98
                                             );
                      local_b10 = *ppgVar21;
                      local_b20 = (_Base_ptr)
                                  std::
                                  map<ggml_backend_*,_ggml_tallocr,_std::less<ggml_backend_*>,_std::allocator<std::pair<ggml_backend_*const,_ggml_tallocr>_>_>
                                  ::find((map<ggml_backend_*,_ggml_tallocr,_std::less<ggml_backend_*>,_std::allocator<std::pair<ggml_backend_*const,_ggml_tallocr>_>_>
                                          *)__y,(key_type *)0x1145f7);
                      ppVar22 = std::
                                _Rb_tree_iterator<std::pair<ggml_backend_*const,_ggml_tallocr>_>::
                                operator->((_Rb_tree_iterator<std::pair<ggml_backend_*const,_ggml_tallocr>_>
                                            *)0x11461e);
                      local_b18 = &ppVar22->second;
                      ggml_tallocr_alloc(local_b18,local_b00);
                      bVar6 = ggml_backend_is_cpu(local_b10);
                      if ((bVar6 & 1) == 0) {
                        ggml_nbytes(local_b00);
                        std::vector<char,_std::allocator<char>_>::resize
                                  ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffef80,
                                   in_stack_ffffffffffffef78);
                        pcVar10 = std::vector<char,_std::allocator<char>_>::data
                                            ((vector<char,_std::allocator<char>_> *)0x1146e9);
                        ggml_nbytes(local_b00);
                        std::istream::read((char *)local_230,(long)pcVar10);
                        pgVar1 = local_b00;
                        pcVar10 = std::vector<char,_std::allocator<char>_>::data
                                            ((vector<char,_std::allocator<char>_> *)0x114744);
                        uVar9 = ggml_nbytes(local_b00);
                        ggml_backend_tensor_set(pgVar1,pcVar10,0,uVar9);
                      }
                      else {
                        pvVar2 = local_b00->data;
                        ggml_nbytes();
                        std::istream::read((char *)local_230,(long)pvVar2);
                      }
                      bVar7 = std::operator==(&this_00->first,(char *)__y);
                      if ((bVar7) && ((local_a81 & 1) == 0)) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  (in_stack_ffffffffffffefa0,(char *)in_stack_ffffffffffffef98,
                                   in_stack_ffffffffffffef90);
                        std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                                      *)in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98);
                        local_b30 = (_Base_ptr)
                                    std::
                                    map<ggml_backend_*,_ggml_tallocr,_std::less<ggml_backend_*>,_std::allocator<std::pair<ggml_backend_*const,_ggml_tallocr>_>_>
                                    ::find((map<ggml_backend_*,_ggml_tallocr,_std::less<ggml_backend_*>,_std::allocator<std::pair<ggml_backend_*const,_ggml_tallocr>_>_>
                                            *)__y,(key_type *)0x114831);
                        ppVar22 = std::
                                  _Rb_tree_iterator<std::pair<ggml_backend_*const,_ggml_tallocr>_>::
                                  operator->((_Rb_tree_iterator<std::pair<ggml_backend_*const,_ggml_tallocr>_>
                                              *)0x114852);
                        std::__cxx11::string::~string(local_b50);
                        std::allocator<char>::~allocator(&local_b51);
                        local_b28 = &ppVar22->second;
                        ggml_tallocr_alloc(&ppVar22->second,*(undefined8 *)(local_18 + 0x10));
                        ggml_backend_tensor_copy(local_b00,*(undefined8 *)(local_18 + 0x10));
                        lVar12 = ggml_nbytes(*(undefined8 *)(local_18 + 0x10));
                        local_a80 = lVar12 + local_a80;
                      }
                      bVar7 = std::operator==(&this_00->first,(char *)__y);
                      if (bVar7) {
                        local_a81 = 1;
                      }
                      lVar12 = ggml_nbytes(local_b00);
                      local_a80 = lVar12 + local_a80;
                      local_240 = 0;
                    }
                    else {
                      uVar9 = std::__cxx11::string::c_str();
                      uVar20 = ggml_nbytes(local_b00);
                      fprintf(pFVar3,
                              "%s: tensor \'%s\' has wrong size in model file: got %zu, expected %zu\n"
                              ,"gpt2_model_load",uVar9,uVar20,local_ab8[2] * local_b08);
                      local_1 = 0;
                      local_240 = 1;
                    }
                  }
                  else {
                    uVar9 = std::__cxx11::string::c_str();
                    __y = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>
                           *)CONCAT44((int)((ulong)__y >> 0x20),local_ab8[0]);
                    this_00 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>
                               *)CONCAT44((int)((ulong)this_00 >> 0x20),local_ab8[1]);
                    fprintf(pFVar3,
                            "%s: tensor \'%s\' has wrong shape in model file: got [%d, %d], expected [%d, %d]\n"
                            ,"gpt2_model_load",uVar9,local_b00->ne[0] & 0xffffffff,
                            local_b00->ne[1] & 0xffffffff);
                    local_1 = 0;
                    local_240 = 1;
                  }
                }
                else {
                  uVar9 = std::__cxx11::string::c_str();
                  fprintf(pFVar3,"%s: tensor \'%s\' has wrong size in model file\n",
                          "gpt2_model_load",uVar9);
                  local_1 = 0;
                  local_240 = 1;
                }
              }
              std::__cxx11::string::~string(local_ae0);
            } while (local_240 == 0);
            std::vector<char,_std::allocator<char>_>::~vector
                      ((vector<char,_std::allocator<char>_> *)
                       CONCAT17(in_stack_ffffffffffffef77,in_stack_ffffffffffffef70));
            if (local_240 == 0) {
              std::ifstream::close();
              uVar9 = ggml_new_tensor_1d(*(undefined8 *)local_2a8,0x1a,(long)(int)local_18[1]);
              *(undefined8 *)(local_18 + 0x3a) = uVar9;
              uVar9 = ggml_new_tensor_1d(*(undefined8 *)local_2a8,0x1a,(long)(int)local_18[1]);
              *(undefined8 *)(local_18 + 0x3c) = uVar9;
              ggml_set_name(*(undefined8 *)(local_18 + 0x3a),"in/embd");
              ggml_set_name(*(undefined8 *)(local_18 + 0x3c),"in/position");
              lVar12 = ggml_nbytes(*(undefined8 *)(local_18 + 0x3a));
              local_b60 = ggml_nbytes(*(undefined8 *)(local_18 + 0x3c));
              local_b60 = lVar12 + local_b60;
              if (*(int *)(local_28 + 0x18) < (int)local_18[4]) {
                local_1078 = local_860;
              }
              else {
                local_1078 = local_858;
              }
              local_b68 = local_1078;
              uVar9 = ggml_backend_alloc_buffer(local_1078,local_b60 + 0x600);
              *(undefined8 *)(local_18 + 0x2c) = uVar9;
              uVar9 = ggml_backend_name(local_b68);
              printf("%s: backend_in = %s (%zu bytes)\n","gpt2_model_load",uVar9,local_b60);
              ggml_tallocr_new(local_b88,*(undefined8 *)(local_18 + 0x2c));
              ggml_tallocr_alloc(local_b88,*(undefined8 *)(local_18 + 0x3a));
              ggml_tallocr_alloc(local_b88,*(undefined8 *)(local_18 + 0x3c));
              local_1 = 1;
              local_240 = 1;
            }
            std::
            map<ggml_backend_*,_ggml_tallocr,_std::less<ggml_backend_*>,_std::allocator<std::pair<ggml_backend_*const,_ggml_tallocr>_>_>
            ::~map((map<ggml_backend_*,_ggml_tallocr,_std::less<ggml_backend_*>,_std::allocator<std::pair<ggml_backend_*const,_ggml_tallocr>_>_>
                    *)0x114c80);
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
            ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_backend_*>_>_>
                    *)0x114c8d);
          }
        }
      }
      else {
        uVar9 = std::__cxx11::string::c_str();
        fprintf(pFVar3,"%s: invalid model file \'%s\' (bad vocab size %d != %d)\n","gpt2_model_load"
                ,uVar9,(ulong)local_258,(ulong)*local_18);
        local_1 = 0;
        local_240 = 1;
      }
    }
    else {
      uVar9 = std::__cxx11::string::c_str();
      fprintf(pFVar3,"%s: invalid model file \'%s\' (bad magic)\n","gpt2_model_load",uVar9);
      local_1 = 0;
      local_240 = 1;
    }
  }
  else {
    uVar9 = std::__cxx11::string::c_str();
    fprintf(pFVar3,"%s: failed to open \'%s\'\n","gpt2_model_load",uVar9);
    local_1 = 0;
    local_240 = 1;
  }
  std::ifstream::~ifstream(local_230);
  return (bool)(local_1 & 1);
}

Assistant:

bool gpt2_model_load(const std::string & fname, gpt2_model & model, gpt_vocab & vocab, const gpt_params & params) {
    printf("%s: loading model from '%s'\n", __func__, fname.c_str());

    auto fin = std::ifstream(fname, std::ios::binary);
    if (!fin) {
        fprintf(stderr, "%s: failed to open '%s'\n", __func__, fname.c_str());
        return false;
    }

    // verify magic
    {
        uint32_t magic;
        fin.read((char *) &magic, sizeof(magic));
        if (magic != GGML_FILE_MAGIC) {
            fprintf(stderr, "%s: invalid model file '%s' (bad magic)\n", __func__, fname.c_str());
            return false;
        }
    }

    // load hparams
    {
        auto & hparams = model.hparams;

        fin.read((char *) &hparams.n_vocab, sizeof(hparams.n_vocab));
        fin.read((char *) &hparams.n_ctx,   sizeof(hparams.n_ctx));
        fin.read((char *) &hparams.n_embd,  sizeof(hparams.n_embd));
        fin.read((char *) &hparams.n_head,  sizeof(hparams.n_head));
        fin.read((char *) &hparams.n_layer, sizeof(hparams.n_layer));
        fin.read((char *) &hparams.ftype,   sizeof(hparams.ftype));

        const int32_t qntvr = hparams.ftype / GGML_QNT_VERSION_FACTOR;

        printf("%s: n_vocab = %d\n", __func__, hparams.n_vocab);
        printf("%s: n_ctx   = %d\n", __func__, hparams.n_ctx);
        printf("%s: n_embd  = %d\n", __func__, hparams.n_embd);
        printf("%s: n_head  = %d\n", __func__, hparams.n_head);
        printf("%s: n_layer = %d\n", __func__, hparams.n_layer);
        printf("%s: ftype   = %d\n", __func__, hparams.ftype);
        printf("%s: qntvr   = %d\n", __func__, qntvr);

        hparams.ftype %= GGML_QNT_VERSION_FACTOR;
    }

    // load vocab
    {
        int32_t n_vocab = 0;
        fin.read((char *) &n_vocab, sizeof(n_vocab));

        if (n_vocab != model.hparams.n_vocab) {
            fprintf(stderr, "%s: invalid model file '%s' (bad vocab size %d != %d)\n",
                    __func__, fname.c_str(), n_vocab, model.hparams.n_vocab);
            return false;
        }

        std::string word;
        std::vector<char> buf(128);

        for (int i = 0; i < n_vocab; i++) {
            uint32_t len;
            fin.read((char *) &len, sizeof(len));

            buf.resize(len);
            fin.read((char *) buf.data(), len);
            word.assign(buf.data(), len);

            vocab.token_to_id[word] = i;
            vocab.id_to_token[i] = word;
        }
    }

    // for the big tensors, we have the option to store the data in 16-bit floats or quantized
    // in order to save memory and also to speed up the computation
    ggml_type wtype = ggml_ftype_to_ggml_type((ggml_ftype) (model.hparams.ftype));
    if (wtype == GGML_TYPE_COUNT) {
        fprintf(stderr, "%s: invalid model file '%s' (bad ftype value %d)\n",
                __func__, fname.c_str(), model.hparams.ftype);
        return false;
    }

    auto & ctx = model.ctx_w;

    // create the ggml context
    {
        size_t n_tensors = 3 /* input */ + 2 /* kv */ + 6 + 12*model.hparams.n_layer;
        struct ggml_init_params params = {
            /*.mem_size   =*/ ggml_tensor_overhead() * n_tensors,
            /*.mem_buffer =*/ NULL,
            /*.no_alloc   =*/ true,
        };

        model.ctx_w = ggml_init(params);
        if (!model.ctx_w) {
            fprintf(stderr, "%s: ggml_init() failed\n", __func__);
            return false;
        }
    }

    // create tensors for the weights
    {
        const auto & hparams = model.hparams;

        const int n_embd  = hparams.n_embd;
        const int n_layer = hparams.n_layer;
        const int n_ctx   = hparams.n_ctx;
        const int n_vocab = hparams.n_vocab;

        model.layers.resize(n_layer);

        model.ln_f_g = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_embd);
        model.ln_f_b = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_embd);

        model.wte     = ggml_new_tensor_2d(ctx, wtype,         n_embd, n_vocab);
        model.wpe     = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, n_embd, n_ctx);
        model.lm_head = ggml_new_tensor_2d(ctx, wtype,         n_embd, n_vocab);

        // map by name
        model.tensors["model/ln_f/g"] = model.ln_f_g;
        model.tensors["model/ln_f/b"] = model.ln_f_b;

        model.tensors["model/wte"]     = model.wte;
        model.tensors["model/wpe"]     = model.wpe;
        model.tensors["model/lm_head"] = model.lm_head;

        for (int i = 0; i < n_layer; ++i) {
            auto & layer = model.layers[i];

            layer.ln_1_g        = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);
            layer.ln_1_b        = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);

            layer.ln_2_g        = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);
            layer.ln_2_b        = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);

            layer.c_attn_attn_w = ggml_new_tensor_2d(ctx, wtype,           n_embd, 3*n_embd);
            layer.c_attn_attn_b = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, 3*n_embd);

            layer.c_attn_proj_w = ggml_new_tensor_2d(ctx, wtype,           n_embd, n_embd);
            layer.c_attn_proj_b = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);

            layer.c_mlp_fc_w    = ggml_new_tensor_2d(ctx, wtype,           n_embd, 4*n_embd);
            layer.c_mlp_fc_b    = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, 4*n_embd);

            layer.c_mlp_proj_w  = ggml_new_tensor_2d(ctx, wtype,         4*n_embd, n_embd);
            layer.c_mlp_proj_b  = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);

            // map by name
            model.tensors["model/h" + std::to_string(i) + "/ln_1/g"]        = layer.ln_1_g;
            model.tensors["model/h" + std::to_string(i) + "/ln_1/b"]        = layer.ln_1_b;

            model.tensors["model/h" + std::to_string(i) + "/ln_2/g"]        = layer.ln_2_g;
            model.tensors["model/h" + std::to_string(i) + "/ln_2/b"]        = layer.ln_2_b;

            model.tensors["model/h" + std::to_string(i) + "/attn/c_attn/w"] = layer.c_attn_attn_w;
            model.tensors["model/h" + std::to_string(i) + "/attn/c_attn/b"] = layer.c_attn_attn_b;

            model.tensors["model/h" + std::to_string(i) + "/attn/c_proj/w"] = layer.c_attn_proj_w;
            model.tensors["model/h" + std::to_string(i) + "/attn/c_proj/b"] = layer.c_attn_proj_b;

            model.tensors["model/h" + std::to_string(i) + "/mlp/c_fc/w"]    = layer.c_mlp_fc_w;
            model.tensors["model/h" + std::to_string(i) + "/mlp/c_fc/b"]    = layer.c_mlp_fc_b;

            model.tensors["model/h" + std::to_string(i) + "/mlp/c_proj/w"]  = layer.c_mlp_proj_w;
            model.tensors["model/h" + std::to_string(i) + "/mlp/c_proj/b"]  = layer.c_mlp_proj_b;
        }
    }

    // assign tensors to backends
    init_backends(model, params);
    ggml_backend_t backend_gpu = model.backends.front();
    ggml_backend_t backend_cpu = model.backends.back();
    std::map<std::string, ggml_backend_t> tensor_backends;
    {
        const int i_gpu_first_layer = model.hparams.n_layer - params.n_gpu_layers;
        for (auto it : model.tensors) {
            const std::string & name = it.first;
            // input tensors
            if (name == "model/wte" || name == "model/wpe") {
                if (params.n_gpu_layers > model.hparams.n_layer) {
                    tensor_backends[name] = backend_gpu;
                } else {
                    tensor_backends[name] = backend_cpu;
                }
            }
            // output tensors
            if (name == "model/ln_f/g" || name == "model/ln_f/b" || name == "model/lm_head") {
                if (params.n_gpu_layers > 0) {
                    tensor_backends[name] = backend_gpu;
                } else {
                    tensor_backends[name] = backend_cpu;
                }
            }
            // layer tensors
            if (name.substr(0, 7) == "model/h") {
                // parse layer number
                int layer = std::stoi(name.substr(7, 2));
                if (layer >= i_gpu_first_layer) {
                    tensor_backends[name] = backend_gpu;
                } else {
                    tensor_backends[name] = backend_cpu;
                }
            }
        }
    }

    // allocate buffers
    std::map<ggml_backend_t, ggml_tallocr> backend_buffers;
    for (auto backend : model.backends) {
        // compute the size of the buffer
        size_t size = 0;
        for (auto it : model.tensors) {
            if (tensor_backends[it.first] == backend) {
                size += ggml_nbytes(it.second) + 512;
            }
        }
        if (size > 0) {
            printf("%s: %8s buffer size = %8.2f MB\n", __func__, ggml_backend_name(backend), size/1024.0/1024.0);
            // allocate the buffer
            ggml_backend_buffer_t buffer = ggml_backend_alloc_buffer(backend, size);
            ggml_backend_buffer_set_usage(buffer, GGML_BACKEND_BUFFER_USAGE_WEIGHTS);
            model.buffers_w.push_back(buffer);

            // create an allocator for the buffer to allocate the tensors
            auto alloc = ggml_tallocr_new(buffer);
            backend_buffers.insert(std::make_pair(backend, std::move(alloc)));
        } else {
            model.buffers_w.push_back(NULL);
        }
    }

    // allocate key + value memory
    {
        const auto & hparams = model.hparams;

        const int n_embd  = hparams.n_embd;
        const int n_layer = hparams.n_layer;
        const int n_ctx   = hparams.n_ctx;

        const int n_mem      = n_layer*n_ctx;
        const int n_elements = n_embd*n_mem;

        model.memory_k = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_elements);
        model.memory_v = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_elements);

        ggml_set_name(model.memory_k, "model/memory_k");
        ggml_set_name(model.memory_v, "model/memory_v");

        const size_t memory_size = ggml_nbytes(model.memory_k) + ggml_nbytes(model.memory_v);

        printf("%s: memory size = %8.2f MB, n_mem = %d\n", __func__, memory_size/1024.0/1024.0, n_mem);

        // create a backend buffer (can be in host or device memory)
        ggml_backend_t backend_kv = params.n_gpu_layers >= hparams.n_layer/2 ? backend_gpu : backend_cpu;
        printf("%s: backend_kv = %s\n", __func__, ggml_backend_name(backend_kv));
        model.buffer_kv = ggml_backend_alloc_buffer(backend_kv, memory_size + 512*2);

        // allocate the tensors into the backend buffer
        {
            ggml_tallocr alloc = ggml_tallocr_new(model.buffer_kv);

            // this updates the pointers in the tensors to point to the correct location in the buffer
            // this is necessary since the ggml_context is .no_alloc == true
            // note that the buffer can actually be a device buffer, depending on the backend
            ggml_tallocr_alloc(&alloc, model.memory_k);
            ggml_tallocr_alloc(&alloc, model.memory_v);
        }
    }

    // load weights
    {
        size_t total_size = 0;

        bool has_lm_head = false;

        std::vector<char> read_buf;

        while (true) {
            int32_t n_dims;
            int32_t length;
            int32_t ttype;

            fin.read(reinterpret_cast<char *>(&n_dims), sizeof(n_dims));
            fin.read(reinterpret_cast<char *>(&length), sizeof(length));
            fin.read(reinterpret_cast<char *>(&ttype),  sizeof(ttype));

            if (fin.eof()) {
                break;
            }

            int32_t nelements = 1;
            int32_t ne[2] = { 1, 1 };
            for (int i = 0; i < n_dims; ++i) {
                fin.read(reinterpret_cast<char *>(&ne[i]), sizeof(ne[i]));
                nelements *= ne[i];
            }

            std::string name(length, 0);
            fin.read(&name[0], length);

            if (model.tensors.find(name) == model.tensors.end()) {
                fprintf(stderr, "%s: unknown tensor '%s' in model file\n", __func__, name.c_str());
                return false;
            }

            auto tensor = model.tensors[name];
            ggml_set_name(tensor, name.c_str());
            if (ggml_nelements(tensor) != nelements) {
                fprintf(stderr, "%s: tensor '%s' has wrong size in model file\n", __func__, name.c_str());
                return false;
            }

            if (tensor->ne[0] != ne[0] || tensor->ne[1] != ne[1]) {
                fprintf(stderr, "%s: tensor '%s' has wrong shape in model file: got [%d, %d], expected [%d, %d]\n",
                        __func__, name.c_str(), (int) tensor->ne[0], (int) tensor->ne[1], ne[0], ne[1]);
                return false;
            }

            // for debugging
            if (0) {
                printf("%24s - [%5d, %5d], type = %6s, %6.2f MB, %9zu bytes\n", name.c_str(), ne[0], ne[1], ggml_type_name(ggml_type(ttype)), ggml_nbytes(tensor)/1024.0/1024.0, ggml_nbytes(tensor));
            }

            const size_t bpe = ggml_type_size(ggml_type(ttype));

            if ((nelements*bpe)/ggml_blck_size(tensor->type) != ggml_nbytes(tensor)) {
                fprintf(stderr, "%s: tensor '%s' has wrong size in model file: got %zu, expected %zu\n",
                        __func__, name.c_str(), ggml_nbytes(tensor), nelements*bpe);
                return false;
            }

            // allocate the tensor
            ggml_backend_t backend = tensor_backends[name];
            ggml_tallocr * alloc = &backend_buffers.find(backend)->second;
            ggml_tallocr_alloc(alloc, tensor);
            //printf("%s: [%5.5s] %s\n", __func__, ggml_backend_name(backend), name.c_str());

            if (ggml_backend_is_cpu(backend)
#ifdef GGML_USE_METAL
                || ggml_backend_is_metal(backend)
#endif
                ) {
                // for the CPU and Metal backend, we can read directly into the tensor
                fin.read(reinterpret_cast<char *>(tensor->data), ggml_nbytes(tensor));
            } else {
                // read into a temporary buffer first, then copy to device memory
                read_buf.resize(ggml_nbytes(tensor));
                fin.read(read_buf.data(), ggml_nbytes(tensor));
                ggml_backend_tensor_set(tensor, read_buf.data(), 0, ggml_nbytes(tensor));
            }

            // GPT-2 models share the WTE tensor as the LM head
            if (name == "model/wte" && has_lm_head == false) {
                ggml_tallocr * alloc_head = &backend_buffers.find(tensor_backends["model/lm_head"])->second;
                ggml_tallocr_alloc(alloc_head, model.lm_head);
                //printf("%s: [%5.5s] %s (copied)\n", __func__, ggml_backend_name(tensor_backends["model/lm_head"]), "model/lm_head");
                ggml_backend_tensor_copy(tensor, model.lm_head);
                total_size += ggml_nbytes(model.lm_head);
            }

            if (name == "model/lm_head") {
                has_lm_head = true;
            }

            total_size += ggml_nbytes(tensor);
        }
        printf("%s: model size  = %8.2f MB\n", __func__, total_size/1024.0/1024.0);
    }

    fin.close();

    // allocate input tensors
    {
        model.embd = ggml_new_tensor_1d(ctx, GGML_TYPE_I32, model.hparams.n_ctx);
        model.position = ggml_new_tensor_1d(ctx, GGML_TYPE_I32, model.hparams.n_ctx);

        ggml_set_name(model.embd, "in/embd");
        ggml_set_name(model.position, "in/position");

        // add input tensors to cpu backend
        size_t input_size = ggml_nbytes(model.embd) + ggml_nbytes(model.position);

        // FIXME: use cpu backend after sched impl
        ggml_backend_t backend_input = params.n_gpu_layers >= model.hparams.n_layer ? backend_gpu : backend_cpu;
        model.buffer_input = ggml_backend_alloc_buffer(backend_input, input_size + 512*3);
        printf("%s: backend_in = %s (%zu bytes)\n", __func__, ggml_backend_name(backend_input), input_size);

        // allocate the tensors into the backend buffer
        ggml_tallocr alloc = ggml_tallocr_new(model.buffer_input);
        ggml_tallocr_alloc(&alloc, model.embd);
        ggml_tallocr_alloc(&alloc, model.position);
    }

    return true;
}